

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::mapSkeletonMetacharacters
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          UnicodeString *patternForm,int32_t *flags,UErrorCode *status)

{
  short sVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  wchar16 wVar5;
  char16_t *pcVar6;
  long lVar7;
  char16_t *pcVar8;
  wchar16 wVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  UChar UVar14;
  uint uVar15;
  uint uVar16;
  UChar local_c2;
  char16_t *local_c0;
  uint local_b4;
  UnicodeString *local_b0;
  ulong local_a8;
  UnicodeString *local_a0;
  DateTimePatternGenerator *local_98;
  ulong local_90;
  _func_int **local_88;
  UErrorCode *local_80;
  byte *local_78;
  UnicodeString local_70;
  
  local_88 = (_func_int **)&PTR__UnicodeString_0048be70;
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  sVar1 = (patternForm->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar16 = (patternForm->fUnion).fFields.fLength;
  }
  else {
    uVar16 = (int)sVar1 >> 5;
  }
  uVar13 = (ulong)uVar16;
  local_98 = this;
  local_80 = status;
  local_78 = (byte *)flags;
  if (0 < (int)uVar16) {
    pcVar8 = (char16_t *)((long)&patternForm->fUnion + 2);
    local_b4 = uVar16 - 1;
    bVar4 = false;
    uVar16 = 0;
    local_c0 = pcVar8;
    local_b0 = patternForm;
    local_a8 = uVar13;
    local_a0 = __return_storage_ptr__;
    local_90 = uVar13;
    do {
      uVar2 = (patternForm->fUnion).fStackFields.fLengthAndFlags;
      if ((short)uVar2 < 0) {
        uVar11 = *(uint *)((long)&patternForm->fUnion + 4);
      }
      else {
        uVar11 = (int)(short)uVar2 >> 5;
      }
      wVar5 = L'\xffff';
      if (uVar16 < uVar11) {
        pcVar6 = pcVar8;
        if ((uVar2 & 2) == 0) {
          pcVar6 = (patternForm->fUnion).fFields.fArray;
        }
        wVar5 = pcVar6[(int)uVar16];
      }
      if (wVar5 == L'\'') {
        bVar4 = !bVar4;
        bVar3 = true;
      }
      else {
        bVar3 = true;
        if (bVar4) {
          bVar4 = true;
        }
        else if (wVar5 == L'j') {
LAB_002eb5b1:
          iVar12 = uVar16 + 1;
          uVar10 = 0;
          if (iVar12 < (int)uVar13) {
            pcVar8 = local_c0;
            if ((uVar2 & 2) == 0) {
              pcVar8 = (patternForm->fUnion).fFields.fArray;
            }
            uVar10 = ~uVar16 + (int)uVar13;
            lVar7 = 0;
            uVar15 = uVar16;
            do {
              wVar9 = L'\xffff';
              if (uVar15 + 1 < uVar11) {
                wVar9 = pcVar8[iVar12 + lVar7];
              }
              if (wVar9 != wVar5) {
                uVar10 = (uint)lVar7;
                uVar16 = uVar15;
                break;
              }
              lVar7 = lVar7 + 1;
              uVar16 = local_b4;
              uVar15 = uVar15 + 1;
            } while (local_90 - (long)iVar12 != lVar7);
          }
          iVar12 = (uVar10 >> 1) + 3;
          if (uVar10 < 2) {
            iVar12 = 1;
          }
          if (wVar5 == L'j') {
            wVar5 = local_98->fDefaultHourFormatChar;
            UVar14 = L'a';
LAB_002eb707:
            if ((wVar5 == L'k') || (wVar5 == L'H')) {
              iVar12 = 0;
            }
            if (0 < iVar12) {
              iVar12 = iVar12 + 1;
              do {
                local_c2 = UVar14;
                icu_63::UnicodeString::doAppend(&local_70,&local_c2,0,1);
                iVar12 = iVar12 + -1;
              } while (1 < iVar12);
            }
            __return_storage_ptr__ = local_a0;
            uVar13 = local_a8;
            uVar11 = uVar10 & 1 | 2;
            do {
              local_c2 = wVar5;
              icu_63::UnicodeString::doAppend(&local_70,&local_c2,0,1);
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
          }
          else {
            uVar11 = local_98->fAllowedHourFormats[0];
            if (uVar11 == 0xffffffff) {
              *local_80 = U_INVALID_FORMAT_ERROR;
              (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject = local_88;
              (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
              UVar14 = L'a';
              wVar5 = L'h';
            }
            else {
              wVar5 = L'h';
              if (uVar11 - 1 < 5) {
                wVar5 = L"HhHhH"[uVar11 - 1];
              }
              UVar14 = L'B';
              if ((uVar11 & 0xfffffffe) != 4) {
                UVar14 = (ushort)((uVar11 & 0xfffffffe) == 2) + L'a';
              }
            }
            if (uVar11 != 0xffffffff) goto LAB_002eb707;
            bVar3 = false;
            uVar13 = local_a8;
            __return_storage_ptr__ = local_a0;
          }
          bVar4 = false;
          patternForm = local_b0;
          pcVar8 = local_c0;
        }
        else {
          if (wVar5 == L'J') {
            local_c2 = L'H';
            icu_63::UnicodeString::doAppend(&local_70,&local_c2,0,1);
            *local_78 = *local_78 | 2;
          }
          else {
            if (wVar5 == L'C') goto LAB_002eb5b1;
            local_c2 = wVar5;
            icu_63::UnicodeString::doAppend(&local_70,&local_c2,0,1);
          }
          bVar4 = false;
        }
      }
      if (!bVar3) goto LAB_002eb7bb;
      uVar16 = uVar16 + 1;
    } while ((int)uVar16 < (int)uVar13);
  }
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,&local_70);
LAB_002eb7bb:
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::mapSkeletonMetacharacters(const UnicodeString& patternForm, int32_t* flags, UErrorCode& status) {
    UnicodeString patternFormMapped;
    patternFormMapped.remove();
    UBool inQuoted = FALSE;
    int32_t patPos, patLen = patternForm.length();
    for (patPos = 0; patPos < patLen; patPos++) {
        UChar patChr = patternForm.charAt(patPos);
        if (patChr == SINGLE_QUOTE) {
            inQuoted = !inQuoted;
        } else if (!inQuoted) {
            // Handle special mappings for 'j' and 'C' in which fields lengths
            // 1,3,5 => hour field length 1
            // 2,4,6 => hour field length 2
            // 1,2 => abbreviated dayPeriod (field length 1..3)
            // 3,4 => long dayPeriod (field length 4)
            // 5,6 => narrow dayPeriod (field length 5)
            if (patChr == LOW_J || patChr == CAP_C) {
                int32_t extraLen = 0; // 1 less than total field length
                while (patPos+1 < patLen && patternForm.charAt(patPos+1)==patChr) {
                    extraLen++;
                    patPos++;
                }
                int32_t hourLen = 1 + (extraLen & 1);
                int32_t dayPeriodLen = (extraLen < 2)? 1: 3 + (extraLen >> 1);
                UChar hourChar = LOW_H;
                UChar dayPeriodChar = LOW_A;
                if (patChr == LOW_J) {
                    hourChar = fDefaultHourFormatChar;
                } else {
                    AllowedHourFormat preferred;
                    if (fAllowedHourFormats[0] != ALLOWED_HOUR_FORMAT_UNKNOWN) {
                        preferred = (AllowedHourFormat)fAllowedHourFormats[0];
                    } else {
                        status = U_INVALID_FORMAT_ERROR;
                        return UnicodeString();
                    }
                    if (preferred == ALLOWED_HOUR_FORMAT_H || preferred == ALLOWED_HOUR_FORMAT_HB || preferred == ALLOWED_HOUR_FORMAT_Hb) {
                        hourChar = CAP_H;
                    }
                    // in #13183 just add b/B to skeleton, no longer need to set special flags
                    if (preferred == ALLOWED_HOUR_FORMAT_HB || preferred == ALLOWED_HOUR_FORMAT_hB) {
                        dayPeriodChar = CAP_B;
                    } else if (preferred == ALLOWED_HOUR_FORMAT_Hb || preferred == ALLOWED_HOUR_FORMAT_hb) {
                        dayPeriodChar = LOW_B;
                    }
                }
                if (hourChar==CAP_H || hourChar==LOW_K) {
                    dayPeriodLen = 0;
                }
                while (dayPeriodLen-- > 0) {
                    patternFormMapped.append(dayPeriodChar);
                }
                while (hourLen-- > 0) {
                    patternFormMapped.append(hourChar);
                }
            } else if (patChr == CAP_J) {
                // Get pattern for skeleton with H, then replace H or k
                // with fDefaultHourFormatChar (if different)
                patternFormMapped.append(CAP_H);
                *flags |= kDTPGSkeletonUsesCapJ;
            } else {
                patternFormMapped.append(patChr);
            }
        }
    }
    return patternFormMapped;
}